

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

int __thiscall RenX::Server::connect(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  rep rVar2;
  pointer pcVar3;
  string_view text;
  string local_38;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastAttempt).__d.__r = rVar2;
  pcVar3 = (pointer)(this->m_clientHostname)._M_string_length;
  if (pcVar3 != (pointer)0x0) {
    pcVar3 = (this->m_clientHostname)._M_dataplus._M_p;
  }
  iVar1 = Jupiter::Socket::connect
                    ((char *)&this->m_sock,(ushort)(this->m_hostname)._M_dataplus._M_p,
                     (char *)(ulong)this->m_port,(ushort)pcVar3);
  if ((char)iVar1 == '\0') {
    this->m_connected = false;
    this->m_attempts = this->m_attempts + 1;
  }
  else {
    Jupiter::Socket::setBlocking(SUB81(&this->m_sock,0));
    string_printf_abi_cxx11_
              (&local_38,"a%.*s\n",(this->m_pass)._M_string_length,(this->m_pass)._M_dataplus._M_p);
    text._M_str = local_38._M_dataplus._M_p;
    text._M_len = local_38._M_string_length;
    sendSocket(this,text);
    std::__cxx11::string::~string((string *)&local_38);
    this->m_connected = true;
    this->m_attempts = 0;
  }
  return iVar1;
}

Assistant:

bool RenX::Server::connect() {
	m_lastAttempt = std::chrono::steady_clock::now();
	if (m_sock.connect(m_hostname.c_str(), m_port, m_clientHostname.empty() ? nullptr : m_clientHostname.c_str()))
	{
		m_sock.setBlocking(false);
		sendSocket(string_printf("a%.*s\n", m_pass.size(), m_pass.data()));
		m_connected = true;
		m_attempts = 0;
		return true;
	}
	m_connected = false;
	++m_attempts;
	return false;
}